

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.hpp
# Opt level: O2

void njoy::tools::disco::Integer<33u>::write<long,std::back_insert_iterator<std::__cxx11::string>>
               (long *value,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *iter)

{
  int iVar1;
  ostream *poVar2;
  long i;
  long lVar3;
  string local_1b8 [8];
  long local_1b0;
  ostringstream buffer;
  undefined8 uStack_188;
  uint auStack_180 [88];
  
  lVar3 = *value;
  i = -lVar3;
  if (0 < lVar3) {
    i = lVar3;
  }
  iVar1 = Integer<33U>::minimumRequiredWidth<long>(i);
  lVar3 = *value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer);
  *(uint *)((long)auStack_180 + *(long *)(_buffer + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(_buffer + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)((long)&uStack_188 + *(long *)(_buffer + -0x18)) = 0x21;
  if ((uint)(iVar1 - (int)(lVar3 >> 0x3f)) < 0x22) {
    std::ostream::_M_insert<long>((long)&buffer);
  }
  else {
    poVar2 = std::operator<<(&buffer,0x2a);
    std::operator<<(poVar2,'*');
  }
  std::__cxx11::stringbuf::str();
  for (lVar3 = 0; local_1b0 != lVar3; lVar3 = lVar3 + 1) {
    std::__cxx11::string::push_back((char)iter->container);
  }
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buffer);
  return;
}

Assistant:

static void write( const Representation& value, Iterator& iter ) {

    // std::abs does not exist for all integer types (e.g. unsigned)
    const Representation absValue = value < 0 ? -value : value;
    const auto required = minimumRequiredWidth( absValue )
                        + ( value < 0 ? 1 : 0 );

    std::ostringstream buffer;
    buffer << std::right << std::setw( Width );
    if ( required > Width ) {

      buffer << std::setfill( '*' ) << '*';
    }
    else {

      buffer << value;
    }

    for ( auto b : buffer.str() ) {

      *iter++ = b;
    }
  }